

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_viewport.cpp
# Opt level: O1

bool __thiscall ON_Viewport::GetFrustumBottomPlane(ON_Viewport *this,ON_Plane *bottom_plane)

{
  double dVar1;
  byte bVar2;
  ON_2dVector v;
  ON_3dVector OStack_88;
  ON_3dVector local_70;
  ON_3dVector local_58;
  ON_2dVector local_40;
  
  bVar2 = this->m_bValidFrustum & this->m_bValidCamera;
  if (bVar2 == 1) {
    if (this->m_projection == perspective_view) {
      ON_2dVector::ON_2dVector(&local_40,this->m_frus_near,this->m_frus_bottom);
      bVar2 = ON_2dVector::Unitize(&local_40);
      (bottom_plane->origin).z = (this->m_CamLoc).z;
      dVar1 = (this->m_CamLoc).y;
      (bottom_plane->origin).x = (this->m_CamLoc).x;
      (bottom_plane->origin).y = dVar1;
      ::operator*(&OStack_88,-local_40.y,&this->m_CamY);
      ::operator*(&local_70,local_40.x,&this->m_CamZ);
      ON_3dVector::operator+(&local_58,&OStack_88,&local_70);
      (bottom_plane->xaxis).z = local_58.z;
      (bottom_plane->xaxis).x = local_58.x;
      (bottom_plane->xaxis).y = local_58.y;
      (bottom_plane->yaxis).z = (this->m_CamX).z;
      dVar1 = (this->m_CamX).y;
      (bottom_plane->yaxis).x = (this->m_CamX).x;
      (bottom_plane->yaxis).y = dVar1;
      ::operator*(&OStack_88,local_40.x,&this->m_CamY);
      ::operator*(&local_70,local_40.y,&this->m_CamZ);
      ON_3dVector::operator+(&local_58,&OStack_88,&local_70);
      (bottom_plane->zaxis).z = local_58.z;
      (bottom_plane->zaxis).x = local_58.x;
      (bottom_plane->zaxis).y = local_58.y;
    }
    else {
      ::operator*(&OStack_88,this->m_frus_bottom,&this->m_CamY);
      ON_3dPoint::operator+((ON_3dPoint *)&local_58,&this->m_CamLoc,&OStack_88);
      (bottom_plane->origin).z = local_58.z;
      (bottom_plane->origin).x = local_58.x;
      (bottom_plane->origin).y = local_58.y;
      (bottom_plane->xaxis).z = (this->m_CamZ).z;
      dVar1 = (this->m_CamZ).y;
      (bottom_plane->xaxis).x = (this->m_CamZ).x;
      (bottom_plane->xaxis).y = dVar1;
      dVar1 = (this->m_CamX).y;
      (bottom_plane->yaxis).x = (this->m_CamX).x;
      (bottom_plane->yaxis).y = dVar1;
      (bottom_plane->yaxis).z = (this->m_CamX).z;
      dVar1 = (this->m_CamY).y;
      (bottom_plane->zaxis).x = (this->m_CamY).x;
      (bottom_plane->zaxis).y = dVar1;
      (bottom_plane->zaxis).z = (this->m_CamY).z;
      bVar2 = true;
    }
    ON_Plane::UpdateEquation(bottom_plane);
  }
  return (bool)bVar2;
}

Assistant:

bool ON_Viewport::GetFrustumBottomPlane( 
  ON_Plane& bottom_plane 
  ) const
{
  bool rc = m_bValidCamera && m_bValidFrustum;
  if (rc)
  {
    if ( IsPerspectiveProjection() )
    {
      ON_2dVector v(m_frus_near,m_frus_bottom);
      rc = v.Unitize();
      bottom_plane.origin = m_CamLoc;
      bottom_plane.xaxis = -v.y*m_CamY + v.x*m_CamZ;
      bottom_plane.yaxis =  m_CamX;
      bottom_plane.zaxis =  v.x*m_CamY + v.y*m_CamZ;
    }
    else
    {
      bottom_plane.origin = m_CamLoc + m_frus_bottom*m_CamY;
      bottom_plane.xaxis =  m_CamZ;
      bottom_plane.yaxis =  m_CamX;
      bottom_plane.zaxis =  m_CamY;
    }
    bottom_plane.UpdateEquation();
  }
  return rc;
}